

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_fare_attributes_db(feed_db_t *db,fare_attributes_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_158 [8];
  char qr [117];
  sqlite3_stmt *local_d8;
  sqlite3_stmt *stmt;
  int local_c8;
  int i;
  int record_count;
  feed_db_status_t res;
  fare_attributes_t record;
  fare_attributes_t **records_local;
  feed_db_t *db_local;
  
  record.transfer_duration = (double)records;
  local_c8 = count_rows_db(db,"fare_attributes");
  stmt._4_4_ = 0;
  db_local._4_4_ = local_c8;
  if (0 < local_c8) {
    memcpy(local_158,
           "SELECT fare_id, price, currency_type, payment_method,transfers, agency_id, transfer_duration FROM `fare_attributes`;"
           ,0x75);
    sqlite3_prepare_v2(db->conn,local_158,-1,&local_d8,(char **)0x0);
    pvVar2 = malloc((long)local_c8 * 0xa0);
    *(void **)record.transfer_duration = pvVar2;
    if (*(long *)record.transfer_duration == 0) {
      sqlite3_finalize(local_d8);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(local_d8);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_fare_attributes((fare_attributes_t *)&record_count);
        puVar3 = sqlite3_column_text(local_d8,0);
        strcpy((char *)&record_count,(char *)puVar3);
        record.fare_id._56_8_ = sqlite3_column_double(local_d8,1);
        puVar3 = sqlite3_column_text(local_d8,2);
        strcpy((char *)&record.price,(char *)puVar3);
        record.price._4_4_ = sqlite3_column_int(local_d8,3);
        record.currency_type = (char  [4])sqlite3_column_int(local_d8,4);
        puVar3 = sqlite3_column_text(local_d8,5);
        strcpy((char *)&record.payment_method,(char *)puVar3);
        record._144_8_ = sqlite3_column_double(local_d8,6);
        memcpy((void *)(*(long *)record.transfer_duration + (long)stmt._4_4_ * 0xa0),&record_count,
               0xa0);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < local_c8);
      sqlite3_finalize(local_d8);
      db_local._4_4_ = local_c8;
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_fare_attributes_db(feed_db_t *db, fare_attributes_t **records) {

    fare_attributes_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "fare_attributes");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "fare_id, price, currency_type, payment_method,"
                    "transfers, agency_id, transfer_duration "
                "FROM `fare_attributes`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_fare_attributes(&record);

        strcpy(record.fare_id, sqlite3_column_text(stmt, 0));
        record.price = sqlite3_column_double(stmt, 1);
        strcpy(record.currency_type, sqlite3_column_text(stmt, 2));
        record.payment_method = (payment_method_t)sqlite3_column_int(stmt, 3);
        record.transfers = (transfers_state_t)sqlite3_column_int(stmt, 4);
        strcpy(record.agency_id, sqlite3_column_text(stmt, 5));
        record.transfer_duration = sqlite3_column_double(stmt, 6);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}